

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_namer.h
# Opt level: O0

string * __thiscall
flatbuffers::BfbsNamer::Denamespace<reflection::Object_const*>
          (string *__return_storage_ptr__,BfbsNamer *this,Object *t,char delimiter)

{
  String *this_00;
  char *__s;
  allocator<char> local_49;
  string local_48;
  char local_21;
  Object *pOStack_20;
  char delimiter_local;
  Object *t_local;
  BfbsNamer *this_local;
  
  local_21 = delimiter;
  pOStack_20 = t;
  t_local = (Object *)this;
  this_local = (BfbsNamer *)__return_storage_ptr__;
  this_00 = reflection::Object::name(t);
  __s = String::c_str(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
  Namer::Denamespace(__return_storage_ptr__,&this->super_Namer,&local_48,local_21);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

std::string Denamespace(T t, const char delimiter = '.') const {
    return Namer::Denamespace(t->name()->c_str(), delimiter);
  }